

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_encoder.cpp
# Opt level: O2

void __thiscall encoder_Hx_basic_demo_Test::TestBody(encoder_Hx_basic_demo_Test *this)

{
  ostream *poVar1;
  array<bool,_2048UL> output;
  array<bool,_6144UL> input;
  _Bvector_base<std::allocator<bool>_> _Stack_2048;
  array<bool,_2048UL> local_2020;
  array<bool,_6144UL> local_1820;
  
  memset(&local_1820,0,0x1800);
  memset(&local_2020,0,0x800);
  std::operator<<((ostream *)&std::cout,"------------------------\n");
  std::operator<<((ostream *)&std::cout,"Input nonzeros:\n");
  HelpersForTests::get_bitstring<bool>((vector<bool,_std::allocator<bool>_> *)&_Stack_2048,0x1800);
  HelpersForTests::vec_to_arr<bool,6144ul>
            ((vector<bool,_std::allocator<bool>_> *)&_Stack_2048,&local_1820);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&_Stack_2048);
  HelpersForTests::print_nz_inds<std::array<bool,6144ul>>(&local_1820);
  std::operator<<((ostream *)&std::cout,"------------------------\n");
  LDPC4QKD::encode<bool>(&local_1820,&local_2020);
  std::operator<<((ostream *)&std::cout,"Syndrome nonzeros:\n");
  HelpersForTests::print_nz_inds<std::array<bool,2048ul>>(&local_2020);
  std::operator<<((ostream *)&std::cout,"------------------------\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Syndrome hash: ");
  HelpersForTests::hash_vector<std::array<bool,2048ul>>(&local_2020);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

TEST(encoder, Hx_basic_demo) {
    std::array<Bit, AutogenLDPC::N> input{};
    std::array<Bit, AutogenLDPC::M> output{};

    std::cout << "------------------------\n";
    std::cout << "Input nonzeros:\n";
    vec_to_arr<Bit, AutogenLDPC::N>(get_bitstring(AutogenLDPC::N), input);
    // noise_bitstring_inplace(input, 0.5, seed);

    print_nz_inds(input);

    std::cout << "------------------------\n";

    encode(input, output);

    std::cout << "Syndrome nonzeros:\n";
    print_nz_inds(output);

    std::cout << "------------------------\n";

    std::cout << "Syndrome hash: " << hash_vector(output) << std::endl;
}